

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec3 vec3_rotate_about_axis(vec3 vec,vec3 axis,float theta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_28;
  undefined4 uStack_24;
  
  fVar4 = axis.z;
  fVar3 = vec.z;
  fVar1 = cosf(theta);
  fVar2 = sinf(theta);
  local_38 = vec.x;
  uStack_34 = vec.y;
  local_28 = axis.x;
  uStack_24 = axis.y;
  fVar5 = fVar4 * fVar3 + local_28 * local_38 + uStack_34 * uStack_24;
  fVar6 = 1.0 - fVar1;
  vVar7.z = (uStack_34 * local_28 - uStack_24 * local_38) * fVar2 +
            fVar5 * fVar4 * fVar6 + fVar1 * fVar3;
  vVar7.y = (fVar4 * local_38 - local_28 * fVar3) * fVar2 +
            uStack_24 * fVar5 * fVar6 + uStack_34 * fVar1;
  vVar7.x = (uStack_24 * fVar3 - fVar4 * uStack_34) * fVar2 +
            local_28 * fVar5 * fVar6 + local_38 * fVar1;
  return vVar7;
}

Assistant:

vec3 vec3_rotate_about_axis(vec3 vec, vec3 axis, float theta) {
    float c = cosf(theta);
    float s = sinf(theta);

    float x = vec.x;
    float y = vec.y;
    float z = vec.z;

    float u = axis.x;
    float v = axis.y;
    float w = axis.z;

    vec3 rotated_vec;
    rotated_vec.x = u * (u * x + v * y + w * z) * (1.0f - c) + x * c + (-w * y + v * z) * s;
    rotated_vec.y = v * (u * x + v * y + w * z) * (1.0f - c) + y * c + (w * x - u * z) * s;
    rotated_vec.z = w * (u * x + v * y + w * z) * (1.0f - c) + z * c + (-v * x + u * y) * s;
    return rotated_vec;
}